

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O0

bool __thiscall
cmFileInstaller::InstallFile
          (cmFileInstaller *this,string *fromFile,string *toFile,MatchProperties match_properties)

{
  bool bVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [8];
  string e_1;
  Status local_160;
  Status local_158;
  string local_150;
  Status local_130;
  Status local_128;
  undefined1 local_120 [8];
  string oldSymlinkTarget;
  undefined1 local_f8 [7];
  bool copy;
  string e;
  undefined1 local_c8 [8];
  string reassembled;
  undefined1 local_78 [8];
  string toDir;
  string newFromFile;
  string *toFile_local;
  string *fromFile_local;
  cmFileInstaller *this_local;
  MatchProperties match_properties_local;
  
  if (this->InstallMode == COPY) {
    match_properties_local._3_1_ =
         cmFileCopier::InstallFile(&this->super_cmFileCopier,fromFile,toFile,match_properties);
    goto LAB_007e93e6;
  }
  std::__cxx11::string::string((string *)(toDir.field_2._M_local_buf + 8));
  if ((((this->InstallMode == REL_SYMLINK) || (this->InstallMode == REL_SYMLINK_OR_COPY)) ||
      (this->InstallMode == SYMLINK)) || (this->InstallMode == SYMLINK_OR_COPY)) {
    cmsys::SystemTools::GetParentDirectory((string *)local_78,toFile);
    cmSystemTools::ForceToRelativePath
              ((string *)((long)&reassembled.field_2 + 8),(string *)local_78,fromFile);
    std::__cxx11::string::operator=
              ((string *)(toDir.field_2._M_local_buf + 8),
               (string *)(reassembled.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(reassembled.field_2._M_local_buf + 8));
    cmsys::SystemTools::CollapseFullPath
              ((string *)local_c8,(string *)(toDir.field_2._M_local_buf + 8),(string *)local_78);
    bVar1 = cmsys::SystemTools::ComparePath((string *)local_c8,fromFile);
    if (bVar1) {
LAB_007e9042:
      e.field_2._12_4_ = 0;
    }
    else {
      if ((this->InstallMode == SYMLINK) || (this->InstallMode == SYMLINK_OR_COPY)) {
        std::__cxx11::string::operator=
                  ((string *)(toDir.field_2._M_local_buf + 8),(string *)fromFile);
        goto LAB_007e9042;
      }
      if (this->InstallMode == REL_SYMLINK_OR_COPY) {
        match_properties_local._3_1_ =
             cmFileCopier::InstallFile(&this->super_cmFileCopier,fromFile,toFile,match_properties);
        e.field_2._12_4_ = 1;
      }
      else {
        cmStrCat<char_const*&,char_const(&)[49],std::__cxx11::string&,char_const(&)[7],std::__cxx11::string_const&,char_const(&)[3]>
                  ((string *)local_f8,&(this->super_cmFileCopier).Name,
                   (char (*) [49])" cannot determine relative path for symlink to \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&toDir.field_2 + 8),(char (*) [7])"\" at \"",toFile,
                   (char (*) [3])0x104275a);
        cmExecutionStatus::SetError((this->super_cmFileCopier).Status,(string *)local_f8);
        match_properties_local._3_1_ = 0;
        e.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_f8);
      }
    }
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)local_78);
    if (e.field_2._12_4_ == 0) goto LAB_007e909e;
  }
  else {
    std::__cxx11::string::operator=((string *)(toDir.field_2._M_local_buf + 8),(string *)fromFile);
LAB_007e909e:
    oldSymlinkTarget.field_2._M_local_buf[0xf] = '\x01';
    if (((this->super_cmFileCopier).Always & 1U) == 0) {
      std::__cxx11::string::string((string *)local_120);
      local_128 = cmsys::SystemTools::ReadSymlink(toFile,(string *)local_120);
      bVar1 = cmsys::Status::operator_cast_to_bool(&local_128);
      if ((bVar1) &&
         (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&toDir.field_2 + 8),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_120), _Var2)) {
        oldSymlinkTarget.field_2._M_local_buf[0xf] = '\0';
      }
      std::__cxx11::string::~string((string *)local_120);
    }
    (*(this->super_cmFileCopier)._vptr_cmFileCopier[5])
              (this,toFile,2,(ulong)((byte)oldSymlinkTarget.field_2._M_local_buf[0xf] & 1));
    if ((oldSymlinkTarget.field_2._M_local_buf[0xf] & 1U) != 0) {
      local_130 = cmsys::SystemTools::RemoveFile(toFile);
      cmsys::SystemTools::GetFilenamePath(&local_150,toFile);
      local_158 = cmsys::SystemTools::MakeDirectory(&local_150,(mode_t *)0x0);
      std::__cxx11::string::~string((string *)&local_150);
      local_160 = cmSystemTools::CreateSymlink((string *)((long)&toDir.field_2 + 8),toFile);
      bVar1 = cmsys::Status::operator_cast_to_bool(&local_160);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        if (((this->InstallMode == ABS_SYMLINK_OR_COPY) ||
            (this->InstallMode == REL_SYMLINK_OR_COPY)) || (this->InstallMode == SYMLINK_OR_COPY)) {
          e_1.field_2._8_8_ = match_properties;
          match_properties_local._3_1_ =
               cmFileCopier::InstallFile
                         (&this->super_cmFileCopier,(string *)((long)&toDir.field_2 + 8),toFile,
                          match_properties);
          e.field_2._12_4_ = 1;
        }
        else {
          cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
          cmStrCat<char_const*&,char_const(&)[28],std::__cxx11::string&,char_const(&)[7],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string,char_const(&)[3]>
                    ((string *)local_188,&(this->super_cmFileCopier).Name,
                     (char (*) [28])" cannot create symlink to \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&toDir.field_2 + 8),(char (*) [7])"\" at \"",toFile,
                     (char (*) [4])0x1001dbf,&local_1a8,(char (*) [3])0x104275a);
          std::__cxx11::string::~string((string *)&local_1a8);
          cmExecutionStatus::SetError((this->super_cmFileCopier).Status,(string *)local_188);
          match_properties_local._3_1_ = 0;
          e.field_2._12_4_ = 1;
          std::__cxx11::string::~string((string *)local_188);
        }
        goto LAB_007e93d0;
      }
    }
    match_properties_local._3_1_ = 1;
    e.field_2._12_4_ = 1;
  }
LAB_007e93d0:
  std::__cxx11::string::~string((string *)(toDir.field_2._M_local_buf + 8));
LAB_007e93e6:
  return (bool)(match_properties_local._3_1_ & 1);
}

Assistant:

bool cmFileInstaller::InstallFile(const std::string& fromFile,
                                  const std::string& toFile,
                                  MatchProperties match_properties)
{
  if (this->InstallMode == cmInstallMode::COPY) {
    return this->cmFileCopier::InstallFile(fromFile, toFile, match_properties);
  }

  std::string newFromFile;

  if (this->InstallMode == cmInstallMode::REL_SYMLINK ||
      this->InstallMode == cmInstallMode::REL_SYMLINK_OR_COPY ||
      this->InstallMode == cmInstallMode::SYMLINK ||
      this->InstallMode == cmInstallMode::SYMLINK_OR_COPY) {
    // Try to get a relative path.
    std::string toDir = cmSystemTools::GetParentDirectory(toFile);
    newFromFile = cmSystemTools::ForceToRelativePath(toDir, fromFile);

    // Double check that we can restore the original path.
    std::string reassembled =
      cmSystemTools::CollapseFullPath(newFromFile, toDir);
    if (!cmSystemTools::ComparePath(reassembled, fromFile)) {
      if (this->InstallMode == cmInstallMode::SYMLINK ||
          this->InstallMode == cmInstallMode::SYMLINK_OR_COPY) {
        // User does not mind, silently proceed with absolute path.
        newFromFile = fromFile;
      } else if (this->InstallMode == cmInstallMode::REL_SYMLINK_OR_COPY) {
        // User expects a relative symbolic link or a copy.
        // Since an absolute symlink won't do, copy instead.
        return this->cmFileCopier::InstallFile(fromFile, toFile,
                                               match_properties);
      } else {
        // We cannot meet user's expectation (REL_SYMLINK)
        auto e = cmStrCat(this->Name,
                          " cannot determine relative path for symlink to \"",
                          newFromFile, "\" at \"", toFile, "\".");
        this->Status.SetError(e);
        return false;
      }
    }
  } else {
    newFromFile = fromFile; // stick with absolute path
  }

  // Compare the symlink value to that at the destination if not
  // always installing.
  bool copy = true;
  if (!this->Always) {
    std::string oldSymlinkTarget;
    if (cmSystemTools::ReadSymlink(toFile, oldSymlinkTarget)) {
      if (newFromFile == oldSymlinkTarget) {
        copy = false;
      }
    }
  }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeLink, copy);

  if (copy) {
    // Remove the destination file so we can always create the symlink.
    cmSystemTools::RemoveFile(toFile);

    // Create destination directory if it doesn't exist
    cmSystemTools::MakeDirectory(cmSystemTools::GetFilenamePath(toFile));

    // Create the symlink.
    if (!cmSystemTools::CreateSymlink(newFromFile, toFile)) {
      if (this->InstallMode == cmInstallMode::ABS_SYMLINK_OR_COPY ||
          this->InstallMode == cmInstallMode::REL_SYMLINK_OR_COPY ||
          this->InstallMode == cmInstallMode::SYMLINK_OR_COPY) {
        // Failed to create a symbolic link, fall back to copying.
        return this->cmFileCopier::InstallFile(newFromFile, toFile,
                                               match_properties);
      }

      auto e = cmStrCat(this->Name, " cannot create symlink to \"",
                        newFromFile, "\" at \"", toFile,
                        "\": ", cmSystemTools::GetLastSystemError(), "\".");
      this->Status.SetError(e);
      return false;
    }
  }

  return true;
}